

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O0

double __thiscall libtorrent::aux::session_impl::log(session_impl *this,double __x)

{
  char in_AL;
  bool bVar1;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double dVar2;
  undefined1 local_f8 [48];
  double local_c8;
  dht_module_t local_3c;
  undefined1 local_38 [8];
  va_list v;
  char *fmt_local;
  module_t m_local;
  session_impl *this_local;
  
  if (in_AL != '\0') {
    local_c8 = __x;
  }
  bVar1 = alert_manager::should_post<libtorrent::dht_log_alert>(&this->m_alerts);
  dVar2 = extraout_XMM0_Qa;
  if (bVar1) {
    v[0].overflow_arg_area = local_f8;
    v[0]._0_8_ = &stack0x00000008;
    local_38._4_4_ = 0x30;
    local_38._0_4_ = 0x18;
    alert_manager::
    emplace_alert<libtorrent::dht_log_alert,libtorrent::dht_log_alert::dht_module_t,char_const*&,__va_list_tag(&)[1]>
              (&this->m_alerts,&local_3c,(char **)&v[0].reg_save_area,
               (__va_list_tag (*) [1])local_38);
    dVar2 = extraout_XMM0_Qa_00;
  }
  return dVar2;
}

Assistant:

void session_impl::log(module_t m, char const* fmt, ...)
	{
		if (!m_alerts.should_post<dht_log_alert>()) return;

		va_list v;
		va_start(v, fmt);
		m_alerts.emplace_alert<dht_log_alert>(
			static_cast<dht_log_alert::dht_module_t>(m), fmt, v);
		va_end(v);
	}